

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O0

void test_ws_location_wrong_http_method(void)

{
  cio_http_cb_return cVar1;
  size_t extraout_RDX;
  char *actual;
  undefined1 local_928 [4];
  cio_http_cb_return cb_ret;
  cio_http_client client;
  undefined1 local_550 [4];
  cio_error err;
  cio_websocket_location_handler handler;
  
  client.buffer_size._4_4_ =
       cio_websocket_location_handler_init
                 ((cio_websocket_location_handler *)local_550,(char **)0x0,0,on_connect,
                  fake_handler_free);
  UnityAssertEqualNumber
            (0,(long)client.buffer_size._4_4_,"web socket handler initialization failed!",0xcb,
             UNITY_DISPLAY_STYLE_INT);
  handler.websocket.ws_private.read_handler_context = local_928;
  client._232_8_ = local_550;
  client.write_response = fake_add_response_header;
  client.close = fake_write_response;
  client.parser.content_length._4_4_ = client.parser.content_length._4_4_ & 0x7fffffff | 0x80000000;
  client.content_length._0_4_ = 3;
  client.rb.fetch_ptr._0_2_ = 1;
  client.rb.fetch_ptr._2_2_ = 1;
  cVar1 = (*handler.http_location.on_fragment)
                    ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                     "Sec-WebSocket-Version",0x15);
  UnityAssertEqualNumber
            (0,(long)cVar1,"on_header_field returned wrong value for sec_ws_version_field",0xdc,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = (*handler.http_location.on_header_field_name)
                    ((cio_http_client *)handler.websocket.ws_private.read_handler_context,"13",2);
  UnityAssertEqualNumber
            (0,(long)cVar1,"on_header_value returned wrong value for sec_ws_version_value",0xde,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = (*handler.http_location.on_fragment)
                    ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                     "Sec-WebSocket-Key",0x11);
  UnityAssertEqualNumber
            (0,(long)cVar1,"on_header_field returned wrong value for sec_ws_key_field",0xe3,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = (*handler.http_location.on_header_field_name)
                    ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                     "dGhlIHNhbXBsZSBub25jZQ==",0x18);
  actual = (char *)(long)cVar1;
  UnityAssertEqualNumber
            (0,(UNITY_INT)actual,"on_header_value returned wrong value for sec_ws_key_value",0xe5,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = (*handler.http_location.on_header_field_value)
                    ((cio_http_client *)handler.websocket.ws_private.read_handler_context,actual,
                     extraout_RDX);
  UnityAssertEqualNumber
            (-1,(long)cVar1,"on_header_complete returned wrong value",0xe8,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_ws_location_wrong_http_method(void)
{
	struct cio_websocket_location_handler handler;
	enum cio_error err = cio_websocket_location_handler_init(&handler, NULL, 0, on_connect, fake_handler_free);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

	struct cio_http_client client;

	handler.websocket.ws_private.http_client = &client;
	handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
	handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
	handler.websocket.ws_private.http_client->write_response = fake_write_response;

	handler.websocket.ws_private.http_client->parser.upgrade = 1;
	handler.websocket.ws_private.http_client->http_method = CIO_HTTP_POST;
	handler.websocket.ws_private.http_client->http_major = 1;
	handler.websocket.ws_private.http_client->http_minor = 1;

	static const char sec_ws_version_field[] = "Sec-WebSocket-Version";
	static const char sec_ws_version_value[] = "13";
	enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_version_field, sizeof(sec_ws_version_field) - 1);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
	cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_version_value, sizeof(sec_ws_version_value) - 1);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

	static const char sec_ws_key_field[] = "Sec-WebSocket-Key";
	static const char sec_ws_key_value[] = "dGhlIHNhbXBsZSBub25jZQ==";
	cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_key_field, sizeof(sec_ws_key_field) - 1);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
	cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_key_value, sizeof(sec_ws_key_value) - 1);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

	cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_ERROR, cb_ret, "on_header_complete returned wrong value");
}